

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

int __thiscall helics::FederateInfo::checkIntProperty(FederateInfo *this,int propId,int defVal)

{
  bool bVar1;
  const_iterator __lhs;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  pair<int,_int> *prop;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  reference in_stack_ffffffffffffffc8;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_28;
  long local_20;
  int local_18;
  int local_14;
  
  local_20 = in_RDI + 0x18;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_28._M_current =
       (pair<int,_int> *)
       CLI::std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                 ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                  in_stack_ffffffffffffffc8);
  __lhs = CLI::std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return local_18;
    }
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::
         __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
         ::operator*(&local_28);
    if (in_stack_ffffffffffffffc8->first == local_14) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&local_28);
  }
  return in_stack_ffffffffffffffc8->second;
}

Assistant:

int FederateInfo::checkIntProperty(int propId, int defVal) const
{
    for (const auto& prop : intProps) {
        if (prop.first == propId) {
            return prop.second;
        }
    }
    return defVal;
}